

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffc2uj(char *cval,ULONGLONG *ival,int *status)

{
  int iVar1;
  ulong uVar2;
  char dtype;
  double dval;
  int lval;
  char sval [81];
  char msg [81];
  byte local_e9;
  double local_e8;
  int local_dc;
  char local_d8 [96];
  char local_78 [88];
  
  if (0 < *status) {
    return *status;
  }
  if (*cval == '\0') {
    *status = 0xcc;
    return 0xcc;
  }
  ffc2uxx(cval,(char *)&local_e9,ival,&local_dc,local_d8,&local_e8,status);
  if (local_e9 < 0x4c) {
    if (local_e9 == 0x43) {
      iVar1 = ffc2dd(local_d8,&local_e8,status);
      if (iVar1 < 1) goto LAB_0014294c;
    }
    else if (local_e9 == 0x46) {
LAB_0014294c:
      iVar1 = 0x19c;
      if ((1.8446744073709552e+19 < local_e8) || (local_e8 < -0.49)) goto LAB_00142990;
      uVar2 = (long)(local_e8 - 9.223372036854776e+18) & (long)local_e8 >> 0x3f | (long)local_e8;
      goto LAB_00142999;
    }
  }
  else {
    if (local_e9 != 0x4c) {
      iVar1 = 0x193;
      if (local_e9 != 0x58) goto LAB_0014299c;
LAB_00142990:
      *status = iVar1;
      goto LAB_001429a2;
    }
    uVar2 = (ulong)local_dc;
LAB_00142999:
    *ival = uVar2;
  }
LAB_0014299c:
  if (*status < 1) {
    return *status;
  }
LAB_001429a2:
  *ival = 0;
  builtin_strncpy(local_78,"Error in ffc2j evaluating string as a long integer: ",0x35);
  strncat(local_78,cval,0x1e);
  ffxmsg(5,local_78);
  return *status;
}

Assistant:

int ffc2uj(const char *cval,     /* I - string representation of the value */
          ULONGLONG *ival,       /* O - numerical value of the input string */
          int *status)          /* IO - error status */
/*
  convert formatted string to a ULONGLONG integer value, doing implicit
  datatype conversion if necessary.
*/
{
    char dtype, sval[81], msg[81];
    int lval;
    double dval;
    
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (cval[0] == '\0')
        return(*status = VALUE_UNDEFINED);  /* null value string */
        
    /* convert the keyword to its native datatype */
    ffc2uxx(cval, &dtype, ival, &lval, sval, &dval, status);

    if (dtype == 'X' )
    {
            *status = BAD_INTKEY;
    }
    else if (dtype == 'C')
    {
            /* try reading the string as a number */
            if (ffc2dd(sval, &dval, status) <= 0)
            {
              if (dval > (double)  DULONGLONG_MAX || dval < -0.49)
                *status = NUM_OVERFLOW;
              else
                *ival = (ULONGLONG) dval;
            }
    }
    else if (dtype == 'F')
    {
            if (dval > (double) DULONGLONG_MAX || dval < -0.49)
                *status = NUM_OVERFLOW;
            else
                *ival = (ULONGLONG) dval;
    }
    else if (dtype == 'L')
    {
            *ival = (ULONGLONG) lval;
    }

    if (*status > 0)
    {
            *ival = 0;
            strcpy(msg,"Error in ffc2j evaluating string as a long integer: ");
            strncat(msg,cval,30);
            ffpmsg(msg);
            return(*status);
    }


    return(*status);
}